

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BSTree.hpp
# Opt level: O1

void __thiscall BSTree<int>::destroy(BSTree<int> *this,BSTNode<int> **tree)

{
  BSTNode<int> *pBVar1;
  BSTNode<int> **ppBVar2;
  
  do {
    ppBVar2 = tree;
    pBVar1 = *ppBVar2;
    if (pBVar1 == (BSTNode<int> *)0x0) {
      return;
    }
    tree = &pBVar1->left;
  } while ((pBVar1->left != (BSTNode<int> *)0x0) ||
          (tree = &pBVar1->right, pBVar1->right != (BSTNode<int> *)0x0));
  operator_delete(pBVar1,0x20);
  *ppBVar2 = (BSTNode<int> *)0x0;
  return;
}

Assistant:

void BSTree<T>::destroy(BSTNode<T>* &tree)
{
	if (tree == nullptr)
		return;

	if (tree->left != nullptr)
		return destroy(tree->left);

	if (tree->right != nullptr)
		return destroy(tree->right);

	delete tree;

	tree = nullptr;
}